

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GUISetting.cpp
# Opt level: O2

void __thiscall GUISetting::acceptSettings(GUISetting *this)

{
  map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
  *this_00;
  _Rb_tree_color _Var1;
  mapped_type mVar2;
  _Rb_tree_color _Var3;
  _Rb_tree_color _Var4;
  _Rb_tree_color _Var5;
  _Rb_tree_node_base *p_Var6;
  byte bVar7;
  int iVar8;
  BoardMode BVar9;
  mapped_type *pmVar10;
  undefined1 *puVar11;
  _Rb_tree_node_base *p_Var12;
  _Rb_tree_node_base *p_Var13;
  bool bVar14;
  OptionsData newOptions;
  QArrayDataPointer<char16_t> local_78;
  mapped_type local_60;
  OptionsData local_5c;
  QArrayDataPointer<char16_t> local_48;
  
  iVar8 = QAbstractSlider::value();
  local_78.d = (Data *)(long)iVar8;
  pmVar10 = std::
            map<unsigned_long,_TileSize,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TileSize>_>_>
            ::at(&Maps::sliderTileSize,(key_type *)&local_78);
  mVar2 = *pmVar10;
  local_60 = (this->currentOptions).tileSize;
  local_5c.tileSize = mVar2;
  if ((mVar2 == local_60) || (this->boardMode != GRAPHIC)) {
    local_78.d = (Data *)((ulong)local_78.d & 0xffffffff00000000);
    std::
    map<GraphicMode,_QRadioButton,_std::less<GraphicMode>,_std::allocator<std::pair<const_GraphicMode,_QRadioButton>_>_>
    ::operator[](&this->mapGraphicMode,(key_type *)&local_78);
    bVar7 = QAbstractButton::isChecked();
    local_5c.graphicMode = (GraphicMode)(bVar7 ^ 1);
    this_00 = &this->mapImageToLoad;
    local_78.d = (Data *)((ulong)local_78.d & 0xffffffff00000000);
    std::
    map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
    ::operator[](this_00,(key_type *)&local_78);
    local_5c.imageToLoad_4 = (bool)QAbstractButton::isChecked();
    local_78.d._0_4_ = 1;
    std::
    map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
    ::operator[](this_00,(key_type *)&local_78);
    local_5c.imageToLoad_5 = (bool)QAbstractButton::isChecked();
    local_78.d._0_4_ = 2;
    std::
    map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
    ::operator[](this_00,(key_type *)&local_78);
    local_5c.imageToLoad_6 = (bool)QAbstractButton::isChecked();
    local_78.d._0_4_ = 3;
    std::
    map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
    ::operator[](this_00,(key_type *)&local_78);
    local_5c.imageToLoad_7 = (bool)QAbstractButton::isChecked();
    local_78.d = (Data *)((ulong)local_78.d._4_4_ << 0x20);
    std::
    map<NumberColor,_QRadioButton,_std::less<NumberColor>,_std::allocator<std::pair<const_NumberColor,_QRadioButton>_>_>
    ::operator[](&this->mapNumberOnImage,(key_type *)&local_78);
    QAbstractButton::group();
    puVar11 = (undefined1 *)QButtonGroup::checkedButton();
    p_Var6 = (this->mapNumberOnImage)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (p_Var12 = p_Var6;
        (p_Var13 = p_Var6,
        (_Rb_tree_header *)p_Var12 != &(this->mapNumberOnImage)._M_t._M_impl.super__Rb_tree_header
        && (p_Var13 = p_Var12, &p_Var12[1]._M_parent != (_Base_ptr *)puVar11));
        p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
    }
    _Var3 = p_Var13[1]._M_color;
    local_78.d = (Data *)((ulong)local_78.d & 0xffffffff00000000);
    local_5c.numberColor = _Var3;
    std::
    map<TileColor,_QRadioButton,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_QRadioButton>_>_>
    ::operator[](&this->mapTileColor,(key_type *)&local_78);
    QAbstractButton::group();
    puVar11 = (undefined1 *)QButtonGroup::checkedButton();
    p_Var6 = (this->mapTileColor)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (p_Var12 = p_Var6;
        (p_Var13 = p_Var6,
        (_Rb_tree_header *)p_Var12 != &(this->mapTileColor)._M_t._M_impl.super__Rb_tree_header &&
        (p_Var13 = p_Var12, &p_Var12[1]._M_parent != (_Base_ptr *)puVar11));
        p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
    }
    bVar14 = mVar2 != local_60;
    _Var4 = p_Var13[1]._M_color;
    _Var1 = (this->currentOptions).numberColor;
    _Var5 = (this->currentOptions).squareColor;
    local_5c.squareColor = _Var4;
    Options::saveOptions(&local_5c);
    BVar9 = this->boardMode;
    if ((bVar14 && BVar9 == NUMERIC) || (_Var3 != _Var1 && BVar9 == GRAPHIC)) {
      Fifteen::redrawTiles(this->owner);
      BVar9 = this->boardMode;
    }
    if ((_Var4 != _Var5) && (BVar9 == NUMERIC)) {
      Fifteen::setColor(this->owner);
    }
    QWidget::close();
  }
  else {
    QString::QString((QString *)&local_78,"");
    QString::QString((QString *)&local_48,
                     "\nSize of a tile can not be changed in graphic mode\t \nwhen an image has been loaded"
                    );
    QMessageBox::information(this,&local_78,&local_48,0x400,0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  }
  return;
}

Assistant:

void GUISetting::acceptSettings()
{
    OptionsData newOptions;

    newOptions.tileSize = Maps::sliderTileSize.at( slider->value() );
    bool tileSizeChanged = newOptions.tileSize != currentOptions.tileSize;
    if ( tileSizeChanged && boardMode == BoardMode::GRAPHIC )
    {
        QMessageBox::information( this, "",
                                  "\nSize of a tile can not be changed in graphic mode\t \nwhen an image has been loaded" );
        return;
    }

    const auto getChecked = [](const auto& mapRadio, const QButtonGroup* group)
    {
        QAbstractButton* checked = group->checkedButton();
        for ( const auto& [key, value] : mapRadio )
        {
            if ( &value == checked )
            {
                return key;
            }
        }
        return mapRadio.begin()->first;
    };

    newOptions.graphicMode = mapGraphicMode[GraphicMode::SCALED].isChecked() ? GraphicMode::SCALED : GraphicMode::CROPPED;
    newOptions.imageToLoad_4 = mapImageToLoad[BoardSize::FOUR].isChecked();
    newOptions.imageToLoad_5 = mapImageToLoad[BoardSize::FIVE].isChecked();
    newOptions.imageToLoad_6 = mapImageToLoad[BoardSize::SIX].isChecked();
    newOptions.imageToLoad_7 = mapImageToLoad[BoardSize::SEVEN].isChecked();
    newOptions.numberColor = getChecked( mapNumberOnImage, mapNumberOnImage[NumberColor::NO].group() );
    newOptions.squareColor = getChecked( mapTileColor, mapTileColor[TileColor::BLUE].group() );

    bool numberImageChanged = newOptions.numberColor != currentOptions.numberColor;
    bool colorChanged = newOptions.squareColor != currentOptions.squareColor;

    Options::saveOptions( newOptions );

    if (( tileSizeChanged && boardMode == BoardMode::NUMERIC  ) ||
        ( numberImageChanged && boardMode == BoardMode::GRAPHIC ))
    {
        owner.redrawTiles();
    }
    if ( colorChanged && boardMode == BoardMode::NUMERIC )
    {
        owner.setColor();
    }
    close();
}